

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_fill_string(lyxp_set *set,char *string,uint16_t str_len)

{
  char *pcVar1;
  char *pcStack_18;
  uint16_t str_len_local;
  char *string_local;
  lyxp_set *set_local;
  
  if (set->type == LYXP_SET_NODE_SET) {
    free((set->val).nodes);
  }
  else if (set->type == LYXP_SET_STRING) {
    free((set->val).nodes);
  }
  set->type = LYXP_SET_STRING;
  pcStack_18 = string;
  if ((str_len == 0) && (*string != '\0')) {
    pcStack_18 = "";
  }
  pcVar1 = strndup(pcStack_18,(ulong)str_len);
  (set->val).str = pcVar1;
  return;
}

Assistant:

static void
set_fill_string(struct lyxp_set *set, const char *string, uint16_t str_len)
{
    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }

    set->type = LYXP_SET_STRING;
    if ((str_len == 0) && (string[0] != '\0')) {
        string = "";
    }
    set->val.str = strndup(string, str_len);
}